

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O3

const_ret_type __thiscall
dlib::
op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::apply(op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
        *this,long r,long param_2)

{
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar1;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  
  pmVar1 = (this->m->op).
           super_basic_op_mm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
           .m1;
  pmVar2 = (this->m->op).
           super_basic_op_mm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
           .m2;
  pfVar3 = (pmVar1->op).ptr;
  lVar4 = (pmVar1->op).cols;
  pfVar5 = (pmVar2->op).ptr;
  lVar8 = (pmVar1->op).stride * r;
  lVar9 = r * (pmVar2->op).stride;
  fVar11 = pfVar3[lVar8] * pfVar5[lVar9];
  if (1 < lVar4) {
    lVar10 = 1;
    do {
      lVar7 = lVar8 + lVar10;
      lVar6 = lVar9 + lVar10;
      lVar10 = lVar10 + 1;
      fVar11 = fVar11 + pfVar3[lVar7] * pfVar5[lVar6];
    } while (lVar4 != lVar10);
  }
  return fVar11;
}

Assistant:

const_ret_type apply ( long r, long ) const
        { 
            type temp = m(r,0);
            for (long c = 1; c < m.nc(); ++c)
                temp += m(r,c);
            return temp; 
        }